

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O1

void __thiscall WangLandauSampler::perform_round_trip(WangLandauSampler *this)

{
  Histogram<unsigned_int> *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  bVar2 = true;
  do {
    (**(this->super_UniformSampler)._vptr_UniformSampler)(this);
    uVar4 = ((this->super_UniformSampler).network)->total_triangles;
    uVar3 = Histogram<unsigned_int>::bin
                      ((this->super_UniformSampler).super_Sampler.histogram,uVar4 / 3);
    this_00 = (this->super_UniformSampler).super_Sampler.histogram;
    if ((uVar3 == this_00->_bins) && (bVar2)) {
      bVar1 = true;
      bVar2 = false;
    }
    else {
      uVar4 = Histogram<unsigned_int>::bin(this_00,uVar4 / 3);
      bVar1 = (bool)(uVar4 != 0 | bVar2);
    }
  } while (bVar1);
  return;
}

Assistant:

void perform_round_trip() {
        bool going_up = true;

        while (true) {
            markov_step();
            unsigned int triangles = network.get_triangles();

            // round-trip control
            if (histogram.bin(triangles) == histogram.bins()
                and going_up) {
                going_up = false;
                //std::cout << "reached up\n";
            }
            else if (histogram.bin(triangles) == 0
                     and not going_up) {
                //std::cout << "reached down\n";
                break;
            }
        }
    }